

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setMeasurementNoiseVariance
          (AttitudeQuaternionEKF *this,double acc,double mag)

{
  byte bVar1;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  MatrixDynSize *in_stack_00000018;
  AttitudeQuaternionEKF *in_stack_00000020;
  bool ok;
  Span<double,__1L> R_span;
  MatrixDynSize R;
  pointer in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  Span<double,__1L> *in_stack_ffffffffffffffb0;
  DiscreteExtendedKalmanFilterHelper *in_stack_ffffffffffffffb8;
  MatrixDynSize local_40 [64];
  
  *(undefined8 *)(in_RDI + 0x2a0) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x2a8) = in_XMM1_Qa;
  iDynTree::MatrixDynSize::MatrixDynSize
            (local_40,*(ulong *)(in_RDI + 0x3e0),*(ulong *)(in_RDI + 0x3e0));
  prepareMeasurementNoiseCovarianceMatrix(in_stack_00000020,in_stack_00000018);
  iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::capacity();
  Span<double,_-1L>::Span
            ((Span<double,__1L> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
             in_stack_ffffffffffffff68,0x6214d0);
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementNoiseCovariance
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setMeasurementNoiseVariance(double acc, double mag)
{
    m_params_qekf.accelerometer_noise_variance = acc;
    m_params_qekf.magnetometer_noise_variance = mag;

    iDynTree::MatrixDynSize R = iDynTree::MatrixDynSize(m_output_size, m_output_size);
    prepareMeasurementNoiseCovarianceMatrix(R);

    iDynTree::Span<double> R_span(R.data(), R.capacity());
    bool ok = ekfSetMeasurementNoiseCovariance(R_span);
    return ok;
}